

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

arena_t * arena_init_locked(tsdn_t *tsdn,uint ind,arena_config_t *config)

{
  arena_t *paVar1;
  
  if (0xffe < ind) {
    return (arena_t *)0x0;
  }
  if (narenas_total.repr == ind) {
    LOCK();
    narenas_total.repr = narenas_total.repr + 1;
    UNLOCK();
  }
  paVar1 = (arena_t *)duckdb_je_arenas[ind].repr;
  if (paVar1 == (arena_t *)0x0) {
    paVar1 = (arena_t *)0x0;
  }
  if (paVar1 != (arena_t *)0x0) {
    return paVar1;
  }
  paVar1 = duckdb_je_arena_new(tsdn,ind,config);
  return paVar1;
}

Assistant:

static arena_t *
arena_init_locked(tsdn_t *tsdn, unsigned ind, const arena_config_t *config) {
	arena_t *arena;

	assert(ind <= narenas_total_get());
	if (ind >= MALLOCX_ARENA_LIMIT) {
		return NULL;
	}
	if (ind == narenas_total_get()) {
		narenas_total_inc();
	}

	/*
	 * Another thread may have already initialized arenas[ind] if it's an
	 * auto arena.
	 */
	arena = arena_get(tsdn, ind, false);
	if (arena != NULL) {
		assert(arena_is_auto(arena));
		return arena;
	}

	/* Actually initialize the arena. */
	arena = arena_new(tsdn, ind, config);

	return arena;
}